

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O0

bool __thiscall QVariant::equals(QVariant *this,QVariant *v)

{
  QMetaType toType;
  bool bVar1;
  QPartialOrdering QVar2;
  QMetaType fromType;
  QMetaType *this_00;
  Private *in_RDI;
  long in_FS_OFFSET;
  QMetaType metatype;
  QMetaTypeInterface *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  bool local_32;
  QMetaType local_20;
  QMetaTypeInterface *local_18;
  QMetaType local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.d_ptr = (QMetaTypeInterface *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = Private::type((Private *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80))
  ;
  local_18 = (QMetaTypeInterface *)metaType((QVariant *)in_stack_ffffffffffffff78);
  bVar1 = ::operator!=((QMetaType *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                       (QMetaType *)in_stack_ffffffffffffff78);
  if (bVar1) {
    QMetaType::iface(&local_10);
    local_20 = Private::type((Private *)
                             CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
    QMetaType::iface(&local_20);
    bVar1 = canBeNumericallyCompared
                      ((QMetaTypeInterface *)
                       CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                       in_stack_ffffffffffffff78);
    if (bVar1) {
      QVar2 = numericCompare((Private *)
                             CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),in_RDI);
      local_32 = ::operator==(QVar2,(QPartialOrdering)0x0);
    }
    else {
      fromType = metaType(in_stack_ffffffffffffff78);
      toType.d_ptr._7_1_ = in_stack_ffffffffffffffa7;
      toType.d_ptr._0_7_ = in_stack_ffffffffffffffa0;
      bVar1 = qvCanConvertMetaObject(fromType,toType);
      if (bVar1) {
        QVar2 = pointerCompare((Private *)
                               CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                               (Private *)in_stack_ffffffffffffff78);
        local_32 = ::operator==(QVar2,(QPartialOrdering)0x0);
      }
      else {
        local_32 = false;
      }
    }
  }
  else {
    bVar1 = QMetaType::isValid(&local_10);
    if (bVar1) {
      this_00 = (QMetaType *)
                Private::storage((Private *)
                                 CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
      Private::storage((Private *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
      local_32 = QMetaType::equals(this_00,(void *)CONCAT17(in_stack_ffffffffffffff87,
                                                            in_stack_ffffffffffffff80),
                                   in_stack_ffffffffffffff78);
    }
    else {
      local_32 = true;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_32;
  }
  __stack_chk_fail();
}

Assistant:

bool QVariant::equals(const QVariant &v) const
{
    auto metatype = d.type();

    if (metatype != v.metaType()) {
        // try numeric comparisons, with C++ type promotion rules (no conversion)
        if (canBeNumericallyCompared(metatype.iface(), v.d.type().iface()))
            return numericCompare(&d, &v.d) == QPartialOrdering::Equivalent;
        // if both types are related pointers to QObjects, check if they point to the same object
        if (qvCanConvertMetaObject(metatype, v.metaType()))
            return pointerCompare(&d, &v.d) == QPartialOrdering::Equivalent;
        return false;
    }

    // For historical reasons: QVariant() == QVariant()
    if (!metatype.isValid())
        return true;

    return metatype.equals(d.storage(), v.d.storage());
}